

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O3

Box<Imath_2_5::Vec3<float>_> *
Imath_2_5::affineTransform<float,float>(Box<Imath_2_5::Vec3<float>_> *box,Matrix44<float> *m)

{
  float fVar1;
  int i;
  long lVar2;
  Box<Imath_2_5::Vec3<float>_> *newBox;
  Box<Imath_2_5::Vec3<float>_> *in_RDI;
  float *pfVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar5 = (box->min).x;
  fVar6 = (box->max).x;
  if (fVar5 <= fVar6) {
    fVar8 = (box->min).y;
    fVar7 = (box->max).y;
    if (fVar8 <= fVar7) {
      fVar9 = (box->min).z;
      fVar1 = (box->max).z;
      if (fVar9 <= fVar1) {
        if ((fVar5 == -3.4028235e+38) && (!NAN(fVar5))) {
          if (((fVar6 == 3.4028235e+38) &&
              ((((!NAN(fVar6) && (fVar8 == -3.4028235e+38)) && (!NAN(fVar8))) &&
               ((fVar7 == 3.4028235e+38 && (!NAN(fVar7))))))) &&
             ((fVar9 == -3.4028235e+38 &&
              (((!NAN(fVar9) && (fVar1 == 3.4028235e+38)) && (!NAN(fVar1))))))) {
            fVar8 = -3.4028235e+38;
            fVar7 = 3.4028235e+38;
            goto LAB_00120a7b;
          }
        }
        (in_RDI->min).x = 3.4028235e+38;
        (in_RDI->min).y = 3.4028235e+38;
        *(undefined8 *)&(in_RDI->min).z = 0xff7fffff7f7fffff;
        (in_RDI->max).y = -3.4028235e+38;
        (in_RDI->max).z = -3.4028235e+38;
        lVar2 = 0;
        pfVar3 = (float *)m;
        do {
          fVar5 = m->x[3][lVar2];
          (&(in_RDI->min).x)[lVar2] = fVar5;
          lVar4 = 0;
          fVar6 = fVar5;
          do {
            fVar9 = *(float *)((long)&(box->min).x + lVar4) * pfVar3[lVar4];
            fVar8 = pfVar3[lVar4] * *(float *)((long)&(box->max).x + lVar4);
            fVar7 = fVar9;
            if (fVar8 <= fVar9) {
              fVar7 = fVar8;
            }
            fVar5 = fVar5 + fVar7;
            if (fVar8 <= fVar9) {
              fVar8 = fVar9;
            }
            fVar6 = fVar6 + fVar8;
            lVar4 = lVar4 + 4;
          } while (lVar4 != 0xc);
          (&(in_RDI->min).x)[lVar2] = fVar5;
          (&(in_RDI->max).x)[lVar2] = fVar6;
          lVar2 = lVar2 + 1;
          pfVar3 = pfVar3 + 1;
        } while (lVar2 != 3);
        return in_RDI;
      }
    }
  }
  else {
    fVar8 = (box->min).y;
    fVar7 = (box->max).y;
  }
LAB_00120a7b:
  (in_RDI->min).x = fVar5;
  (in_RDI->min).y = fVar8;
  (in_RDI->min).z = (box->min).z;
  (in_RDI->max).x = fVar6;
  (in_RDI->max).y = fVar7;
  (in_RDI->max).z = (box->max).z;
  return in_RDI;
}

Assistant:

Box< Vec3<S> >
affineTransform (const Box< Vec3<S> > &box, const Matrix44<T> &m)
{
    //
    // Transform a 3D box by a matrix whose rightmost column
    // is (0 0 0 1), and compute a new box that tightly encloses
    // the transformed box.
    //
    // As in the transform() function, above, we use James Arvo's
    // fast method.
    //

    if (box.isEmpty() || box.isInfinite())
    {
	//
	// A transformed empty or infinite box is still empty or infinite
	//

	return box;
    }

    Box< Vec3<S> > newBox;

    for (int i = 0; i < 3; i++) 
    {
	newBox.min[i] = newBox.max[i] = (S) m[3][i];

	for (int j = 0; j < 3; j++) 
	{
	    S a, b;

	    a = (S) m[j][i] * box.min[j];
	    b = (S) m[j][i] * box.max[j];

	    if (a < b) 
	    {
		newBox.min[i] += a;
		newBox.max[i] += b;
	    }
	    else 
	    {
		newBox.min[i] += b;
		newBox.max[i] += a;
	    }
	}
    }

    return newBox;
}